

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

int rw::null::deviceSystem(DeviceReq req,void *arg0,int32 n)

{
  int32 n_local;
  void *arg0_local;
  DeviceReq req_local;
  
  if (req == DEVICEGETNUMSUBSYSTEMS) {
    arg0_local._4_4_ = 0;
  }
  else if (req == DEVICEGETCURRENTSUBSYSTEM) {
    arg0_local._4_4_ = 0;
  }
  else if (req == DEVICEGETSUBSSYSTEMINFO) {
    arg0_local._4_4_ = 0;
  }
  else {
    arg0_local._4_4_ = 1;
  }
  return arg0_local._4_4_;
}

Assistant:

int
deviceSystem(DeviceReq req, void *arg0, int32 n)
{
	switch(req){
	case DEVICEGETNUMSUBSYSTEMS:
		return 0;
	case DEVICEGETCURRENTSUBSYSTEM:
		return 0;
	case DEVICEGETSUBSSYSTEMINFO:
		return 0;
	default: break;
	}
	return 1;
}